

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::createExtra(QWidgetPrivate *this)

{
  long lVar1;
  bool bVar2;
  pointer pQVar3;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b55e);
  if (!bVar2) {
    std::make_unique<QWExtra>();
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator=
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)in_RDI,
               in_stack_ffffffffffffffd8);
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::~unique_ptr
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)in_RDI);
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b59b);
    pQVar3->glContext = (void *)0x0;
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b5b0);
    pQVar3->proxyWidget = (QGraphicsProxyWidget *)0x0;
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b5c6);
    pQVar3->minw = 0;
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b5db);
    pQVar3->minh = 0;
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b5f0);
    pQVar3->maxw = 0xffffff;
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b605);
    pQVar3->maxh = 0xffffff;
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b61a);
    pQVar3->customDpiX = 0;
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b62e);
    pQVar3->customDpiY = 0;
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b642);
    *(ushort *)&pQVar3->field_0x7c = *(ushort *)&pQVar3->field_0x7c & 0xfffc;
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b660);
    *(ushort *)&pQVar3->field_0x7c = *(ushort *)&pQVar3->field_0x7c & 0xfff3;
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b67e);
    *(ushort *)&pQVar3->field_0x7c = *(ushort *)&pQVar3->field_0x7c & 0xffef;
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b69c);
    *(ushort *)&pQVar3->field_0x7c = *(ushort *)&pQVar3->field_0x7c & 0xffdf;
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b6ba);
    *(ushort *)&pQVar3->field_0x7c = *(ushort *)&pQVar3->field_0x7c & 0xffbf;
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b6d8);
    *(ushort *)&pQVar3->field_0x7c = *(ushort *)&pQVar3->field_0x7c & 0xfeff;
    pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35b6f7);
    *(ushort *)&pQVar3->field_0x7c = *(ushort *)&pQVar3->field_0x7c & 0xff7f;
    createSysExtra(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::createExtra()
{
    if (!extra) {                                // if not exists
        extra = std::make_unique<QWExtra>();
        extra->glContext = nullptr;
#if QT_CONFIG(graphicsview)
        extra->proxyWidget = nullptr;
#endif
        extra->minw = 0;
        extra->minh = 0;
        extra->maxw = QWIDGETSIZE_MAX;
        extra->maxh = QWIDGETSIZE_MAX;
        extra->customDpiX = 0;
        extra->customDpiY = 0;
        extra->explicitMinSize = 0;
        extra->explicitMaxSize = 0;
        extra->autoFillBackground = 0;
        extra->nativeChildrenForced = 0;
        extra->inRenderWithPainter = 0;
        extra->hasWindowContainer = false;
        extra->hasMask = 0;
        createSysExtra();
#ifdef QWIDGET_EXTRA_DEBUG
        static int count = 0;
        qDebug() << "extra" << ++count;
#endif
    }
}